

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Production.cpp
# Opt level: O3

bool __thiscall SGParser::Generator::Production::RHSEquals(Production *this,Production *right)

{
  uint uVar1;
  int iVar2;
  bool bVar3;
  
  bVar3 = true;
  if (this->pRight != right->pRight) {
    uVar1 = this->Length;
    if (uVar1 != right->Length) {
      return false;
    }
    if ((ulong)uVar1 != 0) {
      iVar2 = bcmp(this->pRight + 1,right->pRight + 1,(ulong)uVar1 << 2);
      bVar3 = iVar2 == 0;
    }
  }
  return bVar3;
}

Assistant:

bool Production::RHSEquals(const Production& right) const noexcept {
    if (pRight == right.pRight)
        return true;
    else if (Length != right.Length)
        return false;
    return std::equal(pRight + 1u, pRight + 1u + Length, right.pRight + 1u);
}